

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

bool __thiscall glslang::TIntermediate::addUsedConstantId(TIntermediate *this,int id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  bool bVar6;
  __node_gen_type __node_gen;
  int local_14;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *local_10;
  
  uVar1 = (this->usedConstantId)._M_h._M_bucket_count;
  uVar3 = (ulong)(long)id % uVar1;
  p_Var4 = (this->usedConstantId)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, *(int *)&p_Var4->_M_nxt[1]._M_nxt != id)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, *(int *)&p_Var2[1]._M_nxt == id)) goto LAB_003f9517;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_003f9517:
  if (p_Var5 == (__node_base_ptr)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = p_Var5->_M_nxt == (_Hash_node_base *)0x0;
  }
  if (bVar6 != false) {
    local_10 = &this->usedConstantId;
    local_14 = id;
    std::
    _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
              ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_10,&local_14);
  }
  return bVar6;
}

Assistant:

bool TIntermediate::addUsedConstantId(int id)
{
    if (usedConstantId.find(id) != usedConstantId.end())
        return false;

    usedConstantId.insert(id);

    return true;
}